

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_tableref.hpp
# Opt level: O2

BoundExpressionListRef * __thiscall
duckdb::BoundTableRef::Cast<duckdb::BoundExpressionListRef>(BoundTableRef *this)

{
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  if (this->type == EXPRESSION_LIST) {
    return (BoundExpressionListRef *)this;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Failed to cast bound table ref to type - table ref type mismatch",
             &local_39);
  InternalException::InternalException(this_00,&local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TARGET &Cast() {
		if (type != TARGET::TYPE) {
			throw InternalException("Failed to cast bound table ref to type - table ref type mismatch");
		}
		return reinterpret_cast<TARGET &>(*this);
	}